

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_bar.hpp
# Opt level: O0

char ** duckdb::UnicodeBar::PartialBlocks(void)

{
  return PartialBlocks::PARTIAL_BLOCKS;
}

Assistant:

static const char *const *PartialBlocks() {
		static const char *PARTIAL_BLOCKS[PARTIAL_BLOCKS_COUNT] = {" ",
		                                                           "\xE2\x96\x8F",
		                                                           "\xE2\x96\x8E",
		                                                           "\xE2\x96\x8D",
		                                                           "\xE2\x96\x8C",
		                                                           "\xE2\x96\x8B",
		                                                           "\xE2\x96\x8A",
		                                                           "\xE2\x96\x89"};
		return PARTIAL_BLOCKS;
	}